

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::~BeagleCPUImpl(BeagleCPUImpl<double,_2,_0> *this)

{
  _func_int **pp_Var1;
  BeagleImpl *in_RDI;
  int i_7;
  threadData *td_1;
  int i_6;
  unique_lock<std::mutex> l;
  threadData *td;
  int i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  mutex_type *in_stack_ffffffffffffff58;
  threadData *in_stack_ffffffffffffff60;
  _func_int **pp_Var2;
  int local_4c;
  int local_3c;
  int local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  
  in_RDI->_vptr_BeagleImpl = (_func_int **)&PTR__BeagleCPUImpl_001cc468;
  for (local_c = 0; local_c < *(uint *)&in_RDI[3]._vptr_BeagleImpl; local_c = local_c + 1) {
    if (in_RDI[10]._vptr_BeagleImpl[local_c] != (_func_int *)0x0) {
      free(in_RDI[10]._vptr_BeagleImpl[local_c]);
    }
    if (*(long *)(*(long *)&in_RDI[10].resourceNumber + (ulong)local_c * 8) != 0) {
      free(*(void **)(*(long *)&in_RDI[10].resourceNumber + (ulong)local_c * 8));
    }
  }
  for (local_10 = 0; local_10 < *(uint *)&in_RDI[2]._vptr_BeagleImpl; local_10 = local_10 + 1) {
    if (*(long *)(*(long *)&in_RDI[0xd].resourceNumber + (ulong)local_10 * 8) != 0) {
      free(*(void **)(*(long *)&in_RDI[0xd].resourceNumber + (ulong)local_10 * 8));
    }
  }
  free(*(void **)&in_RDI[0xd].resourceNumber);
  for (local_14 = 0; local_14 < *(uint *)&in_RDI->field_0xc; local_14 = local_14 + 1) {
    if (in_RDI[0xb]._vptr_BeagleImpl[local_14] != (_func_int *)0x0) {
      free(in_RDI[0xb]._vptr_BeagleImpl[local_14]);
    }
    if (*(long *)(*(long *)&in_RDI[0xb].resourceNumber + (ulong)local_14 * 8) != 0) {
      free(*(void **)(*(long *)&in_RDI[0xb].resourceNumber + (ulong)local_14 * 8));
    }
  }
  free(in_RDI[0xb]._vptr_BeagleImpl);
  free(*(void **)&in_RDI[0xb].resourceNumber);
  if ((*(ulong *)&in_RDI[5].resourceNumber & 0x80) == 0) {
    for (local_1c = 0; local_1c < (uint)in_RDI[3].resourceNumber; local_1c = local_1c + 1) {
      if (in_RDI[0xc]._vptr_BeagleImpl[local_1c] != (_func_int *)0x0) {
        free(in_RDI[0xc]._vptr_BeagleImpl[local_1c]);
      }
    }
  }
  else {
    for (local_18 = 0; local_18 < (uint)in_RDI[3].resourceNumber; local_18 = local_18 + 1) {
      if (*(long *)(*(long *)&in_RDI[0xc].resourceNumber + (ulong)local_18 * 8) != 0) {
        free(*(void **)(*(long *)&in_RDI[0xc].resourceNumber + (ulong)local_18 * 8));
      }
    }
    if (*(long *)&in_RDI[0xc].resourceNumber != 0) {
      free(*(void **)&in_RDI[0xc].resourceNumber);
    }
    free(in_RDI[0xd]._vptr_BeagleImpl);
    if (*in_RDI[0xc]._vptr_BeagleImpl != (_func_int *)0x0) {
      free(*in_RDI[0xc]._vptr_BeagleImpl);
    }
  }
  if (in_RDI[0xc]._vptr_BeagleImpl != (_func_int **)0x0) {
    free(in_RDI[0xc]._vptr_BeagleImpl);
  }
  free(*(void **)&in_RDI[7].resourceNumber);
  free(in_RDI[8]._vptr_BeagleImpl);
  if (((ulong)in_RDI[5]._vptr_BeagleImpl & 1) != 0) {
    free(*(void **)&in_RDI[8].resourceNumber);
    free(in_RDI[9]._vptr_BeagleImpl);
    if (((ulong)in_RDI[5]._vptr_BeagleImpl & 0x100) != 0) {
      free(*(void **)&in_RDI[9].resourceNumber);
    }
  }
  free(in_RDI[0xe]._vptr_BeagleImpl);
  free(*(void **)&in_RDI[0xe].resourceNumber);
  free(in_RDI[0xf]._vptr_BeagleImpl);
  free(*(void **)&in_RDI[0xf].resourceNumber);
  free(in_RDI[0x10]._vptr_BeagleImpl);
  if (*(long *)&in_RDI[0x10].resourceNumber != 0) {
    free(*(void **)&in_RDI[0x10].resourceNumber);
  }
  free(in_RDI[0x11]._vptr_BeagleImpl);
  free(*(void **)&in_RDI[0x11].resourceNumber);
  free(in_RDI[0x12]._vptr_BeagleImpl);
  free(*(void **)&in_RDI[0x12].resourceNumber);
  free(in_RDI[0x13]._vptr_BeagleImpl);
  if (in_RDI[7]._vptr_BeagleImpl != (_func_int **)0x0) {
    (**(code **)(*in_RDI[7]._vptr_BeagleImpl + 8))();
  }
  if ((in_RDI[0x13].field_0xc & 1) != 0) {
    for (local_20 = 0; local_20 < in_RDI[0x13].resourceNumber; local_20 = local_20 + 1) {
      pp_Var1 = in_RDI[0x14]._vptr_BeagleImpl;
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      *(undefined1 *)(pp_Var1 + (long)local_20 * 0x17 + 0x16) = 1;
      std::condition_variable::notify_one();
      std::unique_lock<std::mutex>::~unique_lock
                ((unique_lock<std::mutex> *)in_stack_ffffffffffffff60);
    }
    for (local_3c = 0; local_3c < in_RDI[0x13].resourceNumber; local_3c = local_3c + 1) {
      std::thread::join();
    }
    pp_Var1 = in_RDI[0x14]._vptr_BeagleImpl;
    if (pp_Var1 != (_func_int **)0x0) {
      for (pp_Var2 = pp_Var1 + (long)pp_Var1[-1] * 0x17; pp_Var1 != pp_Var2;
          pp_Var2 = pp_Var2 + -0x17) {
        threadData::~threadData(in_stack_ffffffffffffff60);
      }
      operator_delete__(pp_Var1 + -1);
    }
    pp_Var1 = in_RDI[0x17]._vptr_BeagleImpl;
    if (pp_Var1 != (_func_int **)0x0) {
      pp_Var2 = pp_Var1 + (long)pp_Var1[-1] * 2;
      while (pp_Var1 != pp_Var2) {
        pp_Var2 = pp_Var2 + -2;
        std::shared_future<void>::~shared_future((shared_future<void> *)0x181a62);
      }
      operator_delete__(pp_Var1 + -1);
    }
    for (local_4c = 0; local_4c < in_RDI[0x13].resourceNumber; local_4c = local_4c + 1) {
      free(*(void **)(*(long *)&in_RDI[0x14].resourceNumber + (long)local_4c * 8));
    }
    free(*(void **)&in_RDI[0x14].resourceNumber);
    free(in_RDI[0x15]._vptr_BeagleImpl);
  }
  if (((in_RDI[0x13].field_0xd & 1) != 0) &&
     (free(*(void **)&in_RDI[0x15].resourceNumber), (in_RDI[0x13].field_0xe & 1) != 0)) {
    free(in_RDI[0x16]._vptr_BeagleImpl);
    free(*(void **)&in_RDI[0x16].resourceNumber);
  }
  BeagleImpl::~BeagleImpl(in_RDI);
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
BeagleCPUImpl<BEAGLE_CPU_GENERIC>::~BeagleCPUImpl() {
    // free all that stuff...
    // If you delete partials, make sure not to delete the last element
    // which is TEMP_SCRATCH_PARTIAL twice.

    for(unsigned int i=0; i<kEigenDecompCount; i++) {
        if (gCategoryWeights[i] != NULL)
            free(gCategoryWeights[i]);
        if (gStateFrequencies[i] != NULL)
            free(gStateFrequencies[i]);
    }

    for(unsigned int i=0; i<kMatrixCount; i++) {
        if (gTransitionMatrices[i] != NULL)
            free(gTransitionMatrices[i]);
    }
    free(gTransitionMatrices);

    for(unsigned int i=0; i<kBufferCount; i++) {
        if (gPartials[i] != NULL)
            free(gPartials[i]);
        if (gTipStates[i] != NULL)
            free(gTipStates[i]);
    }
    free(gPartials);
    free(gTipStates);

    if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        for(unsigned int i=0; i<kScaleBufferCount; i++) {
            if (gAutoScaleBuffers[i] != NULL)
                free(gAutoScaleBuffers[i]);
        }
        if (gAutoScaleBuffers)
            free(gAutoScaleBuffers);
        free(gActiveScalingFactors);
        if (gScaleBuffers[0] != NULL)
            free(gScaleBuffers[0]);
    } else {
        for(unsigned int i=0; i<kScaleBufferCount; i++) {
            if (gScaleBuffers[i] != NULL)
                free(gScaleBuffers[i]);
        }
    }

    if (gScaleBuffers)
        free(gScaleBuffers);

    free(gCategoryRates);
    free(gPatternWeights);

    if (kPartitionsInitialised) {
        free(gPatternPartitions);
        free(gPatternPartitionsStartPatterns);
        if (kPatternsReordered) {
            free(gPatternsNewOrder);
        }
    }

    free(integrationTmp);
    free(firstDerivTmp);
    free(secondDerivTmp);

//    free(cLikelihoodTmp);
    free(grandDenominatorDerivTmp);
//    free(grandNumeratorUpperBoundDerivTmp);
//    free(grandNumeratorLowerBoundDerivTmp);
    free(grandNumeratorDerivTmp);

    if (crossProductNumeratorTmp != nullptr) {
        free(crossProductNumeratorTmp);
    }

    free(outLogLikelihoodsTmp);
    free(outFirstDerivativesTmp);
    free(outSecondDerivativesTmp);

    free(ones);
    free(zeros);

    delete gEigenDecomposition;

    if (kThreadingEnabled) {
        // Send stop signal to all threads and join them...
        for (int i = 0; i < kNumThreads; i++) {
            threadData* td = &gThreads[i];
            std::unique_lock<std::mutex> l(td->m);
            td->stop = true;
            td->cv.notify_one();
        }

        // Join all the threads
        for (int i = 0; i < kNumThreads; i++) {
            threadData* td = &gThreads[i];
            td->t.join();
        }

        delete[] gThreads;
        delete[] gFutures;

        for (int i=0; i<kNumThreads; i++) {
            free(gThreadOperations[i]);
        }
        free(gThreadOperations);
        free(gThreadOpCounts);
    }

    if (kAutoPartitioningEnabled) {
        free(gAutoPartitionOperations);
        if (kAutoRootPartitioningEnabled) {
            free(gAutoPartitionIndices);
            free(gAutoPartitionOutSumLogLikelihoods);
        }
    }
}